

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.cpp
# Opt level: O0

bool ExtractDestination(CScript *scriptPubKey,CTxDestination *addressRet)

{
  Span<const_unsigned_char> _vch;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  bool bVar1;
  TxoutType TVar2;
  uint uVar3;
  byte *pbVar4;
  long in_FS_OFFSET;
  TxoutType whichType;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  WitnessV1Taproot tap;
  WitnessV0ScriptHash hash_1;
  WitnessV0KeyHash hash;
  CPubKey pubKey;
  WitnessUnknown *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  WitnessUnknown *in_stack_fffffffffffffd08;
  PubKeyDestination *in_stack_fffffffffffffd10;
  WitnessUnknown *__rhs;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffd20;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffd28;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  PayToAnchor *in_stack_fffffffffffffd50;
  bool local_201;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffe20;
  CScript *in_stack_fffffffffffffe28;
  WitnessUnknown local_190 [12];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_fffffffffffffcf8);
  TVar2 = Solver(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  switch(TVar2) {
  case NONSTANDARD:
  case MULTISIG:
  case NULL_DATA:
    CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffffcf8,(CScript *)0x156b18);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                (CNoDestination *)in_stack_fffffffffffffd10);
    CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffffcf8);
    local_201 = false;
    break;
  case ANCHOR:
    PayToAnchor::PayToAnchor(in_stack_fffffffffffffd50);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                (PayToAnchor *)in_stack_fffffffffffffd10);
    PayToAnchor::~PayToAnchor((PayToAnchor *)in_stack_fffffffffffffcf8);
    local_201 = true;
    break;
  case PUBKEY:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffd08,
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffd08,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcf8);
    _vch.m_size._0_4_ = in_stack_fffffffffffffd18;
    _vch.m_data = (uchar *)in_stack_fffffffffffffd10;
    _vch.m_size._4_4_ = in_stack_fffffffffffffd1c;
    CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffd08,_vch);
    bVar1 = CPubKey::IsValid((CPubKey *)in_stack_fffffffffffffcf8);
    if (bVar1) {
      PubKeyDestination::PubKeyDestination
                ((PubKeyDestination *)in_stack_fffffffffffffcf8,(CPubKey *)0x1566be);
      std::
      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
      ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                  in_stack_fffffffffffffd10);
    }
    else {
      CNoDestination::CNoDestination
                ((CNoDestination *)in_stack_fffffffffffffcf8,(CScript *)0x156683);
      std::
      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
      ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                  (CNoDestination *)in_stack_fffffffffffffd10);
      CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffffcf8);
    }
    local_201 = false;
    break;
  case PUBKEYHASH:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffd08,
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffd08,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcf8);
    vch.m_size._0_4_ = in_stack_fffffffffffffd18;
    vch.m_data = (uchar *)in_stack_fffffffffffffd10;
    vch.m_size._4_4_ = in_stack_fffffffffffffd1c;
    uint160::uint160((uint160 *)in_stack_fffffffffffffcf8,vch);
    PKHash::PKHash((PKHash *)in_stack_fffffffffffffcf8,(uint160 *)0x15674e);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                (PKHash *)in_stack_fffffffffffffd10);
    local_201 = true;
    break;
  case SCRIPTHASH:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffd08,
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffd08,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcf8);
    vch_00.m_size._0_4_ = in_stack_fffffffffffffd18;
    vch_00.m_data = (uchar *)in_stack_fffffffffffffd10;
    vch_00.m_size._4_4_ = in_stack_fffffffffffffd1c;
    uint160::uint160((uint160 *)in_stack_fffffffffffffcf8,vch_00);
    ScriptHash::ScriptHash((ScriptHash *)in_stack_fffffffffffffcf8,(uint160 *)0x1567de);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                (ScriptHash *)in_stack_fffffffffffffd10);
    local_201 = true;
    break;
  case WITNESS_V0_SCRIPTHASH:
    WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)in_stack_fffffffffffffcf8);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffd08,
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffd08,
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    BaseHash<uint256>::begin((BaseHash<uint256> *)in_stack_fffffffffffffcf8);
    std::
    copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
              (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
               (uchar *)in_stack_fffffffffffffd08);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                (WitnessV0ScriptHash *)in_stack_fffffffffffffd10);
    local_201 = true;
    break;
  case WITNESS_V0_KEYHASH:
    WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)in_stack_fffffffffffffcf8);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffd08,
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffd08,
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    BaseHash<uint160>::begin((BaseHash<uint160> *)in_stack_fffffffffffffcf8);
    std::
    copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
              (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
               (uchar *)in_stack_fffffffffffffd08);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                (WitnessV0KeyHash *)in_stack_fffffffffffffd10);
    local_201 = true;
    break;
  case WITNESS_V1_TAPROOT:
    WitnessV1Taproot::WitnessV1Taproot((WitnessV1Taproot *)in_stack_fffffffffffffcf8);
    __first._M_current = (uchar *)0x0;
    __last._M_current = (uchar *)local_190;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffd08,
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffd08,
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    XOnlyPubKey::begin((XOnlyPubKey *)in_stack_fffffffffffffcf8);
    std::
    copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
              (__first,__last,(uchar *)in_stack_fffffffffffffd08);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                (WitnessV1Taproot *)in_stack_fffffffffffffd10);
    local_201 = true;
    break;
  case WITNESS_UNKNOWN:
    in_stack_fffffffffffffd08 = (WitnessUnknown *)0x0;
    __rhs = local_190;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)0x0,CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffffd08,
                        CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    uVar3 = (uint)*pbVar4;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffd08,
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    WitnessUnknown::WitnessUnknown
              (in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffcf8);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)CONCAT44(uVar3,in_stack_fffffffffffffd18),__rhs);
    WitnessUnknown::~WitnessUnknown(in_stack_fffffffffffffcf8);
    local_201 = true;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addresstype.cpp"
                  ,0x68,"bool ExtractDestination(const CScript &, CTxDestination &)");
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffffd08);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_201;
}

Assistant:

bool ExtractDestination(const CScript& scriptPubKey, CTxDestination& addressRet)
{
    std::vector<valtype> vSolutions;
    TxoutType whichType = Solver(scriptPubKey, vSolutions);

    switch (whichType) {
    case TxoutType::PUBKEY: {
        CPubKey pubKey(vSolutions[0]);
        if (!pubKey.IsValid()) {
            addressRet = CNoDestination(scriptPubKey);
        } else {
            addressRet = PubKeyDestination(pubKey);
        }
        return false;
    }
    case TxoutType::PUBKEYHASH: {
        addressRet = PKHash(uint160(vSolutions[0]));
        return true;
    }
    case TxoutType::SCRIPTHASH: {
        addressRet = ScriptHash(uint160(vSolutions[0]));
        return true;
    }
    case TxoutType::WITNESS_V0_KEYHASH: {
        WitnessV0KeyHash hash;
        std::copy(vSolutions[0].begin(), vSolutions[0].end(), hash.begin());
        addressRet = hash;
        return true;
    }
    case TxoutType::WITNESS_V0_SCRIPTHASH: {
        WitnessV0ScriptHash hash;
        std::copy(vSolutions[0].begin(), vSolutions[0].end(), hash.begin());
        addressRet = hash;
        return true;
    }
    case TxoutType::WITNESS_V1_TAPROOT: {
        WitnessV1Taproot tap;
        std::copy(vSolutions[0].begin(), vSolutions[0].end(), tap.begin());
        addressRet = tap;
        return true;
    }
    case TxoutType::ANCHOR: {
        addressRet = PayToAnchor();
        return true;
    }
    case TxoutType::WITNESS_UNKNOWN: {
        addressRet = WitnessUnknown{vSolutions[0][0], vSolutions[1]};
        return true;
    }
    case TxoutType::MULTISIG:
    case TxoutType::NULL_DATA:
    case TxoutType::NONSTANDARD:
        addressRet = CNoDestination(scriptPubKey);
        return false;
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}